

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ostream * ccs::anon_unknown_0::operator<<(ostream *os,Type type)

{
  if (type < (STRING|LPAREN)) {
    std::operator<<(os,&DAT_0015dcd0 + *(int *)(&DAT_0015dcd0 + (ulong)type * 4));
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Token::Type type) {
  switch (type) {
  case Token::EOS: os << "end-of-input"; break;
  case Token::LPAREN: os << "'('"; break;
  case Token::RPAREN: os << "')"; break;
  case Token::LBRACE: os << "'{'"; break;
  case Token::RBRACE: os << "'}'"; break;
  case Token::SEMI: os << "';'"; break;
  case Token::COLON: os << "':'"; break;
  case Token::COMMA: os << "','"; break;
  case Token::DOT: os << "'.'"; break;
  case Token::GT: os << "'>'"; break;
  case Token::EQ: os << "'='"; break;
  case Token::SLASH: os << "'/'"; break;
  case Token::CONSTRAIN: os << "'@constrain'"; break;
  case Token::CONTEXT: os << "'@context'"; break;
  case Token::IMPORT: os << "'@import'"; break;
  case Token::OVERRIDE: os << "'@override'"; break;
  case Token::INT: os << "integer"; break;
  case Token::DOUBLE: os << "double"; break;
  case Token::IDENT: os << "identifier"; break;
  case Token::NUMID: os << "numeric/identifier"; break;
  case Token::STRING: os << "string literal"; break;
  }
  return os;
}